

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-pending-instances.c
# Opt level: O1

int run_test_pipe_pending_instances(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t pipe_handle;
  undefined1 local_f8 [232];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,local_f8,0);
  if (iVar1 == 0) {
    uv_pipe_pending_instances(local_f8,8);
    iVar1 = uv_pipe_bind(local_f8,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_001b299e;
    uv_pipe_pending_instances(local_f8,0x10);
    iVar1 = uv_listen(local_f8,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_001b29ab;
    uv_close(local_f8,0);
    iVar1 = uv_run(uVar2,0);
    if (iVar1 == 0) {
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b29c5;
    }
  }
  else {
    run_test_pipe_pending_instances_cold_1();
LAB_001b299e:
    run_test_pipe_pending_instances_cold_2();
LAB_001b29ab:
    run_test_pipe_pending_instances_cold_3();
  }
  run_test_pipe_pending_instances_cold_4();
LAB_001b29c5:
  run_test_pipe_pending_instances_cold_5();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-pending-instances.c"
          ,0x1c,"0 && \"this will never be called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(pipe_pending_instances) {
  int r;
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT_OK(r);

  uv_pipe_pending_instances(&pipe_handle, 8);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  uv_pipe_pending_instances(&pipe_handle, 16);

  r = uv_listen((uv_stream_t*)&pipe_handle, 128, connection_cb);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&pipe_handle, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}